

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

cmSourceFile * __thiscall
cmLocalGenerator::AddCustomCommandToOutput
          (cmLocalGenerator *this,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc,bool replace)

{
  cmCustomCommand *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmSourceFile *pcVar2;
  allocator<char> local_61;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_60;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_58;
  string local_48;
  
  pvVar1 = cmCustomCommand::GetOutputs_abi_cxx11_
                     ((cc->_M_t).
                      super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  if ((pvVar1->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (pvVar1->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Attempt to add a custom rule with no output!",&local_61);
    cmSystemTools::Error(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pcVar2 = (cmSourceFile *)0x0;
  }
  else {
    this_00 = (cc->_M_t).
              super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
              super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
              super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_58,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)&this->DirectoryBacktrace);
    cmCustomCommand::SetBacktrace(this_00,(cmListFileBacktrace *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    local_60._M_head_impl =
         (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
         _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
         super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
    (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl = (cmCustomCommand *)0x0;
    pcVar2 = detail::AddCustomCommandToOutput
                       (this,Generator,
                        (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                        &local_60,replace);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_60);
  }
  return pcVar2;
}

Assistant:

cmSourceFile* cmLocalGenerator::AddCustomCommandToOutput(
  std::unique_ptr<cmCustomCommand> cc, bool replace)
{
  // Make sure there is at least one output.
  if (cc->GetOutputs().empty()) {
    cmSystemTools::Error("Attempt to add a custom rule with no output!");
    return nullptr;
  }

  cc->SetBacktrace(this->DirectoryBacktrace);
  return detail::AddCustomCommandToOutput(*this, cmCommandOrigin::Generator,
                                          std::move(cc), replace);
}